

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::writeMatrixConstructor<2,4>
               (ostream *str,Matrix<float,_4,_2> *m)

{
  bool bVar1;
  bool bVar2;
  ostream *this;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"mat",3);
  this = (ostream *)std::ostream::operator<<(str,2);
  std::__ostream_insert<char,std::char_traits<char>>(this,"x",1);
  std::ostream::operator<<(this,4);
  std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  bVar5 = 0;
  lVar4 = 0;
  uVar3 = extraout_RDX;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar6 = 0;
    do {
      precision = (int)uVar3;
      if (!(bool)(~bVar5 & lVar6 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        precision = extraout_EDX;
      }
      de::floatToString_abi_cxx11_
                (&local_50,(de *)&DAT_00000001,(m->m_data).m_data[lVar4].m_data[lVar6],precision);
      std::__ostream_insert<char,std::char_traits<char>>
                (str,local_50._M_dataplus._M_p,local_50._M_string_length);
      uVar3 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_RDX_01;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar4 = 1;
    bVar5 = 1;
    bVar1 = false;
  } while (bVar2);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}